

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlRegFreeAtom(xmlRegAtomPtr atom)

{
  xmlRegRangePtr pxVar1;
  int iVar2;
  xmlRegAtomType xVar3;
  long lVar4;
  
  if (atom == (xmlRegAtomPtr)0x0) {
    return;
  }
  iVar2 = atom->nbRanges;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      pxVar1 = atom->ranges[lVar4];
      if (pxVar1 != (xmlRegRangePtr)0x0) {
        if (pxVar1->blockName != (xmlChar *)0x0) {
          (*xmlFree)(pxVar1->blockName);
        }
        (*xmlFree)(pxVar1);
        iVar2 = atom->nbRanges;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  if (atom->ranges != (xmlRegRangePtr *)0x0) {
    (*xmlFree)(atom->ranges);
  }
  xVar3 = atom->type;
  if (xVar3 == XML_REGEXP_STRING) {
    if (atom->valuep != (void *)0x0) {
      (*xmlFree)(atom->valuep);
      xVar3 = atom->type;
      if (xVar3 != XML_REGEXP_STRING) goto LAB_0017a546;
    }
    if (atom->valuep2 == (void *)0x0) goto LAB_0017a55f;
    (*xmlFree)(atom->valuep2);
    xVar3 = atom->type;
  }
LAB_0017a546:
  if ((xVar3 == XML_REGEXP_BLOCK_NAME) && (atom->valuep != (void *)0x0)) {
    (*xmlFree)(atom->valuep);
  }
LAB_0017a55f:
  (*xmlFree)(atom);
  return;
}

Assistant:

static void
xmlRegFreeAtom(xmlRegAtomPtr atom) {
    int i;

    if (atom == NULL)
	return;

    for (i = 0;i < atom->nbRanges;i++)
	xmlRegFreeRange(atom->ranges[i]);
    if (atom->ranges != NULL)
	xmlFree(atom->ranges);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep2 != NULL))
	xmlFree(atom->valuep2);
    if ((atom->type == XML_REGEXP_BLOCK_NAME) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    xmlFree(atom);
}